

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment.cpp
# Opt level: O2

void __thiscall so_5::environment_t::impl__run_stats_controller_and_go_further(environment_t *this)

{
  allocator local_e1;
  anon_class_8_1_8991fb9c local_e0 [13];
  string local_78 [96];
  
  std::__cxx11::string::string(local_78,"run_stats_controller",&local_e1);
  local_e0[0].this = this;
  impl__run_layers_and_go_further(this);
  impl__run_stats_controller_and_go_further::anon_class_8_1_8991fb9c::operator()(local_e0);
  std::__cxx11::string::~string(local_78);
  return;
}

Assistant:

void
environment_t::impl__run_stats_controller_and_go_further()
{
	impl::run_stage(
			"run_stats_controller",
			[this] {
				/* there is no need to turn_on controller automatically */
			},
			[this] { m_impl->m_infrastructure->stats_controller().turn_off(); },
			[this] { impl__run_layers_and_go_further(); } );
}